

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

Convolution3DLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_convolution3d(NeuralNetworkLayer *this)

{
  ulong uVar1;
  LayerUnion LVar2;
  Arena *arena;
  
  if (this->_oneof_case_[0] == 0x5bf) {
    LVar2 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x5bf;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    LVar2.convolution3d_ =
         google::protobuf::Arena::
         CreateMaybeMessage<CoreML::Specification::Convolution3DLayerParams>(arena);
    (this->layer_).convolution3d_ = (Convolution3DLayerParams *)LVar2;
  }
  return (Convolution3DLayerParams *)LVar2.convolution_;
}

Assistant:

inline ::CoreML::Specification::Convolution3DLayerParams* NeuralNetworkLayer::_internal_mutable_convolution3d() {
  if (!_internal_has_convolution3d()) {
    clear_layer();
    set_has_convolution3d();
    layer_.convolution3d_ = CreateMaybeMessage< ::CoreML::Specification::Convolution3DLayerParams >(GetArenaForAllocation());
  }
  return layer_.convolution3d_;
}